

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::ProfiledLoopBodyStart<false,true>
          (InterpreterStackFrame *this,uint32 loopNumber,LayoutSize layoutSize,bool isFirstIteration
          )

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  uint uVar4;
  undefined4 *puVar5;
  LoopHeader *loopHeader;
  
  bVar2 = DynamicProfileInfo::EnableImplicitCallFlags(*(FunctionBody **)(this + 0x88));
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1715,
                                "(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()))"
                                ,
                                "Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody())"
                               );
    if (!bVar2) goto LAB_00957e91;
    *puVar5 = 0;
  }
  if (*(char *)(*(long *)(this + 0x78) + 0x143f) == '\x01') {
    TTD::ExecutionInfoManager::UpdateLoopCountInfo
              (*(ExecutionInfoManager **)(*(long *)(*(long *)(this + 0x78) + 0x3b8) + 0x16b0));
  }
  if ((((byte)this[0xd4] & 6) == 0) &&
     (loopHeader = DoLoopBodyStart(this,loopNumber,layoutSize,false,isFirstIteration),
     loopHeader != (LoopHeader *)0x0)) {
    uVar4 = FunctionBody::GetLoopNumber(*(FunctionBody **)(this + 0x88),loopHeader);
    if (uVar4 != loopNumber) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x172b,
                                  "(loopHeader == nullptr || this->m_functionBody->GetLoopNumber(loopHeader) == loopNumber)"
                                  ,
                                  "loopHeader == nullptr || this->m_functionBody->GetLoopNumber(loopHeader) == loopNumber"
                                 );
      if (!bVar2) {
LAB_00957e91:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    uVar4 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this);
    if (((loopHeader->startOffset <= uVar4) && (uVar4 < loopHeader->endOffset)) &&
       (OVar3 = ByteCodeReader::PeekOp((ByteCodeReader *)this), OVar3 != ProfiledLoopEnd)) {
      return;
    }
    *(undefined1 *)(*(long *)(*(long *)(this + 0x78) + 0x3b8) + 0x1570) =
         *(undefined1 *)(*(long *)(this + 0xc0) + (ulong)loopNumber);
  }
  return;
}

Assistant:

void InterpreterStackFrame::ProfiledLoopBodyStart(uint32 loopNumber, LayoutSize layoutSize, bool isFirstIteration)
    {
        Assert(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()));

        if (InterruptProbe)
        {
            this->DoInterruptProbe();
        }

#if ENABLE_TTD
        if (SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext))
        {
            this->scriptContext->GetThreadContext()->TTDExecutionInfo->UpdateLoopCountInfo();
        }
#endif

        if (!JITLoopBody || this->IsInCatchOrFinallyBlock())
        {
            // For functions having try-catch-finally, jit loop bodies for loops that are contained only in a try block,
            // not even indirect containment in a Catch or Finally.
            return;
        }

        LoopHeader const * loopHeader = DoLoopBodyStart(loopNumber, layoutSize, false, isFirstIteration);
        Assert(loopHeader == nullptr || this->m_functionBody->GetLoopNumber(loopHeader) == loopNumber);
        if (loopHeader != nullptr)
        {
            // We executed jitted loop body, no implicit call information available for this loop
            uint currentOffset = m_reader.GetCurrentOffset();

            if (!loopHeader->Contains(currentOffset) || (m_reader.PeekOp() == OpCode::ProfiledLoopEnd))
            {
                // Restore the outer loop's implicit call flags
                scriptContext->GetThreadContext()->SetImplicitCallFlags(this->savedLoopImplicitCallFlags[loopNumber]);
            }
            else
            {
                // We bailout from the loop, just continue collect implicit call flags for this loop
            }
        }
    }